

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::
     domeanout<pltcalc::outrec_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>,period_occ_granular>
               (summarySampleslevelHeader *sh,OASIS_FLOAT mean_val,
               _func_void_outrec_granular_ptr_int_FILE_ptr *OutputData,FILE *outFile,
               map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
               *m_occ,vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  bool bVar1;
  mapped_type *__x;
  reference ppVar2;
  int local_a0;
  period_occ_granular p;
  iterator __end0;
  iterator __begin0;
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> *__range2;
  outrec_granular o;
  OASIS_FLOAT max_loss_local;
  OASIS_FLOAT chance_of_loss_local;
  vector<period_occ_granular,_std::allocator<period_occ_granular>_> *vp_local;
  map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
  *m_occ_local;
  FILE *outFile_local;
  _func_void_outrec_granular_ptr_int_FILE_ptr *OutputData_local;
  OASIS_FLOAT mean_val_local;
  summarySampleslevelHeader *sh_local;
  
  o.occ_date_id._0_4_ = max_loss;
  o.occ_date_id._4_4_ = chance_of_loss;
  __x = std::
        map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
        ::operator[](m_occ,&sh->event_id);
  std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::operator=(vp,__x);
  o.summary_id = sh->event_id;
  __range2._4_4_ = sh->summary_id;
  o.mean = sh->expval;
  o.standard_deviation = sh->expval;
  o.exp_value = sh->expval;
  o.max_impact_exp = o.occ_date_id._4_4_;
  o.mean_impact_exp = (OASIS_FLOAT)o.occ_date_id;
  o.event_id = 0;
  o.period_no = (int)mean_val;
  __end0 = std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::begin(vp);
  p.occ_date_id =
       (longlong)std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>::end(vp);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
                                *)&p.occ_date_id);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
             ::operator*(&__end0);
    p._0_8_ = ppVar2->occ_date_id;
    if (0.0 < (float)o.period_no) {
      local_a0 = (int)*(undefined8 *)ppVar2;
      o.type = local_a0;
      o._40_8_ = p._0_8_;
      (*OutputData)((outrec_granular *)&__range2,1,outFile);
    }
    __gnu_cxx::
    __normal_iterator<period_occ_granular_*,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void domeanout(const summarySampleslevelHeader& sh,
		       OASIS_FLOAT mean_val,
		       void (*OutputData)(const outrecT&, const int, FILE*),
		       FILE * outFile, moccT &m_occ, std::vector<periodT> &vp,
		       const OASIS_FLOAT chance_of_loss,
		       const OASIS_FLOAT max_loss)
	{
		vp = m_occ[sh.event_id];
		outrecT o;
		o.event_id = sh.event_id;
		o.summary_id = sh.summary_id;
		o.exp_value = sh.expval;
		o.max_impact_exp = sh.expval;
		o.mean_impact_exp = sh.expval;
		o.chance_of_loss = chance_of_loss;
		o.max_loss = max_loss;
		o.mean = mean_val;
		o.standard_deviation = 0;
		for (auto p : vp) {
			if (o.mean > 0) {
				o.period_no = p.period_no;
				o.occ_date_id = p.occ_date_id;
				OutputData(o, 1, outFile);
			}
		}
	}